

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase358::run(TestCase358 *this)

{
  StructSchema SVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  bool bVar4;
  Type TVar5;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StringPtr name_11;
  StringPtr name_12;
  StringPtr name_13;
  StringPtr name_14;
  StringPtr name_15;
  StringPtr name_16;
  StringPtr name_17;
  StringPtr name_18;
  StringPtr name_19;
  StringPtr name_20;
  StringPtr name_21;
  StringPtr name_22;
  StringPtr name_23;
  StringPtr name_24;
  StringPtr name_25;
  StringPtr name_26;
  StringPtr name_27;
  StringPtr name_28;
  StringPtr name_29;
  StringPtr name_30;
  StringPtr name_31;
  StringPtr name_32;
  StringPtr name_33;
  StringPtr name_34;
  StringPtr name_35;
  StringPtr name_36;
  StructSchema schema;
  Builder root;
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_2;
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_1;
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition;
  MallocMessageBuilder builder;
  StructSchema local_ad8;
  Builder local_ad0;
  undefined1 local_aa0 [408];
  None *local_908;
  char *local_900;
  size_t local_8f8;
  bool local_8f0;
  undefined1 local_8e8 [416];
  undefined1 local_748 [8];
  undefined1 auStack_740 [400];
  Reader local_5b0;
  uint local_568;
  uint uStack_564;
  undefined4 uStack_560;
  undefined4 uStack_55c;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined7 local_548;
  undefined1 uStack_541;
  undefined7 uStack_540;
  undefined1 uStack_539;
  undefined4 local_538;
  undefined3 uStack_534;
  ArrayDisposer *pAStack_529;
  Reader local_3d8;
  Builder local_390;
  Reader local_350;
  Reader local_318;
  Reader local_2e0;
  Reader local_2a8;
  Builder local_270;
  Builder local_230;
  Builder local_1f0;
  Reader local_1b0;
  Reader local_168;
  MallocMessageBuilder local_120;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  local_ad8.super_Schema.raw = (Schema)((long)schemas::s_9e2e784c915329b6 + 0x48);
  MessageBuilder::getRootInternal((Builder *)local_aa0,&local_120.super_MessageBuilder);
  PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::init
            ((PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7> *)&local_ad0,
             (EVP_PKEY_CTX *)(schemas::s_9e2e784c915329b6 + 0x48));
  name.content.size_ = 4;
  name.content.ptr = "foo";
  StructSchema::getFieldByName((Field *)local_8e8,&local_ad8,name);
  uVar3 = local_8e8._8_4_;
  uVar2 = local_8e8._0_8_;
  local_558._4_4_ = local_8e8._32_4_;
  local_558._0_4_ = local_8e8._28_4_;
  uStack_550._4_4_ = local_8e8._40_4_;
  uStack_550._0_4_ = local_8e8._36_4_;
  local_548 = (undefined7)CONCAT44(local_8e8._48_4_,local_8e8._44_4_);
  uStack_541 = SUB41(local_8e8._48_4_,3);
  uStack_540 = (undefined7)CONCAT44(local_8e8._56_4_,local_8e8._52_4_);
  uStack_539 = SUB41(local_8e8._56_4_,3);
  local_538 = local_8e8._60_4_;
  DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)local_748,&local_ad0);
  if ((bool)local_748[0] != true) {
    local_5b0.type = UNKNOWN;
    local_5b0._4_4_ = 0;
    local_748 = (undefined1  [8])0x0;
    auStack_740._0_8_ = (Schema)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_5b0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_5b0);
  }
  local_aa0._124_4_ = auStack_740._60_4_;
  local_aa0._0_8_ = uVar2;
  local_aa0._8_4_ = uVar3;
  local_aa0[0x33] = uStack_541;
  local_aa0._44_7_ = local_548;
  local_aa0[0x3b] = uStack_539;
  local_aa0._52_7_ = uStack_540;
  local_aa0._28_8_ = local_558;
  local_aa0._36_8_ = uStack_550;
  local_aa0._60_4_ = local_538;
  local_aa0._64_8_ = auStack_740._0_8_;
  local_aa0._72_4_ = auStack_740._8_4_;
  local_aa0._128_8_ = " == ";
  local_aa0._136_8_ = &DAT_00000005;
  local_aa0[0x90] = uVar3 == auStack_740._8_4_ && uVar2 == auStack_740._0_8_;
  if ((uVar3 != auStack_740._8_4_ || uVar2 != auStack_740._0_8_) && (kj::_::Debug::minSeverity < 3))
  {
    name_00.content.size_ = 4;
    name_00.content.ptr = "foo";
    StructSchema::getFieldByName((Field *)&local_5b0,&local_ad8,name_00);
    DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)local_8e8,&local_ad0);
    if (local_8e8[0] != true) {
      local_3d8.type = UNKNOWN;
      local_3d8._4_4_ = 0;
      local_8e8._0_8_ = (RawBrandedSchema *)0x0;
      local_8e8._8_4_ = 0;
      local_8e8._12_4_ = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_3d8,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_3d8);
    }
    auStack_740._4_4_ = local_8e8._12_4_;
    auStack_740._0_4_ = local_8e8._8_4_;
    pAStack_529 = (ArrayDisposer *)local_8e8._64_8_;
    uStack_541 = (undefined1)local_8e8._40_4_;
    uStack_540 = (undefined7)(CONCAT44(local_8e8._44_4_,local_8e8._40_4_) >> 8);
    uStack_539 = (undefined1)local_8e8._48_4_;
    local_538 = (undefined4)(CONCAT44(local_8e8._52_4_,local_8e8._48_4_) >> 8);
    uStack_534 = SUB43(local_8e8._52_4_,1);
    local_748[0] = true;
    auStack_740._8_4_ = local_8e8._16_4_;
    auStack_740._16_4_ = local_8e8._24_4_;
    auStack_740._52_4_ = local_8e8._60_4_;
    auStack_740._56_4_ = (undefined4)local_8e8._64_8_;
    auStack_740._60_4_ = SUB84(local_8e8._64_8_,4);
    kj::_::Debug::
    log<char_const(&)[387],kj::_::DebugComparison<capnp::StructSchema::Field,capnp::StructSchema::Field>&,capnp::StructSchema::Field,capnp::StructSchema::Field>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x16b,ERROR,
               "\"failed: expected \" \"(schema.getFieldByName(\\\"foo\\\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\\\", 363, ::kj::Exception::Type::FAILED, \\\"root.which()\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", _kjCondition, schema.getFieldByName(\"foo\"), (*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 363, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
               ,(char (*) [387])
                "failed: expected (schema.getFieldByName(\"foo\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 363, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
               ,(DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> *)local_aa0
               ,(Field *)&local_5b0,(Field *)auStack_740);
  }
  local_aa0._0_4_ = 3;
  local_aa0._8_4_ = 0x141;
  local_aa0._12_4_ = 0;
  name_33.content.size_ = 4;
  name_33.content.ptr = "bar";
  DynamicStruct::Builder::set(&local_ad0,name_33,(Reader *)local_aa0);
  DynamicValue::Reader::~Reader((Reader *)local_aa0);
  name_01.content.size_ = 4;
  name_01.content.ptr = "bar";
  StructSchema::getFieldByName((Field *)local_8e8,&local_ad8,name_01);
  uVar2 = local_8e8._0_8_;
  local_568 = local_8e8._12_4_;
  local_558._4_4_ = local_8e8._32_4_;
  local_558._0_4_ = local_8e8._28_4_;
  uStack_550._4_4_ = local_8e8._40_4_;
  uStack_550._0_4_ = local_8e8._36_4_;
  local_548 = (undefined7)CONCAT44(local_8e8._48_4_,local_8e8._44_4_);
  uStack_541 = SUB41(local_8e8._48_4_,3);
  uStack_540 = (undefined7)CONCAT44(local_8e8._56_4_,local_8e8._52_4_);
  uStack_539 = SUB41(local_8e8._56_4_,3);
  local_538 = local_8e8._60_4_;
  DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)local_748,&local_ad0);
  if ((bool)local_748[0] != true) {
    local_5b0.type = UNKNOWN;
    local_5b0._4_4_ = 0;
    local_748 = (undefined1  [8])0x0;
    auStack_740._0_8_ = (Schema)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_5b0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_5b0);
  }
  local_aa0._120_4_ = auStack_740._56_4_;
  local_aa0._116_4_ = auStack_740._52_4_;
  local_aa0._124_4_ = auStack_740._60_4_;
  local_aa0._0_8_ = uVar2;
  local_aa0._8_4_ = local_8e8._8_4_;
  local_aa0[0x33] = uStack_541;
  local_aa0._44_7_ = local_548;
  local_aa0[0x3b] = uStack_539;
  local_aa0._52_7_ = uStack_540;
  local_aa0._28_8_ = local_558;
  local_aa0._36_8_ = uStack_550;
  local_aa0._60_4_ = local_538;
  local_aa0._64_8_ = auStack_740._0_8_;
  local_aa0._72_4_ = auStack_740._8_4_;
  local_aa0._128_8_ = " == ";
  local_aa0._136_8_ = &DAT_00000005;
  local_aa0[0x90] = local_8e8._8_4_ == auStack_740._8_4_ && uVar2 == auStack_740._0_8_;
  if ((local_8e8._8_4_ != auStack_740._8_4_ || uVar2 != auStack_740._0_8_) &&
     (kj::_::Debug::minSeverity < 3)) {
    name_02.content.size_ = 4;
    name_02.content.ptr = "bar";
    StructSchema::getFieldByName((Field *)&local_5b0,&local_ad8,name_02);
    DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)local_8e8,&local_ad0);
    if (local_8e8[0] != true) {
      local_3d8.type = UNKNOWN;
      local_3d8._4_4_ = 0;
      local_8e8._0_8_ = (RawBrandedSchema *)0x0;
      local_8e8._8_4_ = 0;
      local_8e8._12_4_ = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_3d8,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_3d8);
    }
    pAStack_529 = (ArrayDisposer *)local_8e8._64_8_;
    uStack_541 = (undefined1)local_8e8._40_4_;
    uStack_540 = (undefined7)(CONCAT44(local_8e8._44_4_,local_8e8._40_4_) >> 8);
    uStack_539 = (undefined1)local_8e8._48_4_;
    local_538 = (undefined4)(CONCAT44(local_8e8._52_4_,local_8e8._48_4_) >> 8);
    uStack_534 = SUB43(local_8e8._52_4_,1);
    local_748[0] = true;
    auStack_740._16_4_ = local_8e8._24_4_;
    auStack_740._52_4_ = local_8e8._60_4_;
    auStack_740._56_4_ = (undefined4)local_8e8._64_8_;
    auStack_740._60_4_ = SUB84(local_8e8._64_8_,4);
    kj::_::Debug::
    log<char_const(&)[387],kj::_::DebugComparison<capnp::StructSchema::Field,capnp::StructSchema::Field>&,capnp::StructSchema::Field,capnp::StructSchema::Field>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x16e,ERROR,
               "\"failed: expected \" \"(schema.getFieldByName(\\\"bar\\\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\\\", 366, ::kj::Exception::Type::FAILED, \\\"root.which()\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", _kjCondition, schema.getFieldByName(\"bar\"), (*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 366, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
               ,(char (*) [387])
                "failed: expected (schema.getFieldByName(\"bar\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 366, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
               ,(DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> *)local_aa0
               ,(Field *)&local_5b0,(Field *)auStack_740);
  }
  name_03.content.size_ = 4;
  name_03.content.ptr = "bar";
  DynamicStruct::Builder::get((Builder *)local_aa0,&local_ad0,name_03);
  local_748._4_4_ =
       DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Builder *)local_aa0);
  local_748._0_4_ = 0x141;
  auStack_740._0_8_ = " == ";
  auStack_740._8_4_ = 5;
  auStack_740._12_4_ = 0;
  auStack_740[0x10] = local_748._4_4_ == 0x141;
  DynamicValue::Builder::~Builder((Builder *)local_aa0);
  if ((auStack_740[0x10] == '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_8e8._0_4_ = 0x141;
    name_04.content.size_ = 4;
    name_04.content.ptr = "bar";
    DynamicStruct::Builder::get((Builder *)local_aa0,&local_ad0,name_04);
    local_568 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                          ((Builder *)local_aa0);
    kj::_::Debug::
    log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x16f,ERROR,
               "\"failed: expected \" \"(321u) == (root.get(\\\"bar\\\").as<uint>())\", _kjCondition, 321u, root.get(\"bar\").as<uint>()"
               ,(char (*) [56])"failed: expected (321u) == (root.get(\"bar\").as<uint>())",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_748,(uint *)local_8e8,&local_568
              );
    DynamicValue::Builder::~Builder((Builder *)local_aa0);
  }
  SVar1.super_Schema.raw = (Schema)(Schema)local_ad0.schema;
  StructBuilder::asReader(&local_ad0.builder);
  local_748 = (undefined1  [8])SVar1.super_Schema.raw;
  name_05.content.size_ = 4;
  name_05.content.ptr = "bar";
  DynamicStruct::Reader::get((Reader *)local_aa0,(Reader *)local_748,name_05);
  local_8e8._4_4_ =
       DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)local_aa0);
  local_8e8._0_4_ = 0x141;
  local_8e8._8_4_ = 0x4d6514;
  local_8e8._12_4_ = 0;
  local_8e8._16_4_ = 5;
  local_8e8._20_4_ = 0;
  local_8e8[0x18] = local_8e8._4_4_ == 0x141;
  DynamicValue::Reader::~Reader((Reader *)local_aa0);
  SVar1.super_Schema.raw = (Schema)(Schema)local_ad0.schema;
  if ((local_8e8[0x18] == '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_568 = 0x141;
    StructBuilder::asReader(&local_ad0.builder);
    local_748 = (undefined1  [8])SVar1.super_Schema.raw;
    name_06.content.size_ = 4;
    name_06.content.ptr = "bar";
    DynamicStruct::Reader::get((Reader *)local_aa0,(Reader *)local_748,name_06);
    local_5b0.type =
         DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)local_aa0);
    kj::_::Debug::
    log<char_const(&)[67],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x170,ERROR,
               "\"failed: expected \" \"(321u) == (root.asReader().get(\\\"bar\\\").as<uint>())\", _kjCondition, 321u, root.asReader().get(\"bar\").as<uint>()"
               ,(char (*) [67])
                "failed: expected (321u) == (root.asReader().get(\"bar\").as<uint>())",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_8e8,&local_568,&local_5b0.type);
    DynamicValue::Reader::~Reader((Reader *)local_aa0);
  }
  name_07.content.size_ = 4;
  name_07.content.ptr = "foo";
  DynamicStruct::Builder::get(&local_270,&local_ad0,name_07);
  DynamicValue::Builder::~Builder(&local_270);
  local_8e8._0_8_ = local_8e8._0_8_ & 0xffffffffffffff00;
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)local_748,(Maybe<kj::Exception> *)local_8e8);
  bVar4 = (bool)local_748[0];
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)local_aa0,(Maybe<kj::Exception> *)local_748);
  local_908 = (None *)&kj::none;
  local_900 = " != ";
  local_8f8 = 5;
  local_8f0 = bVar4;
  if ((bool)local_748[0] == true) {
    kj::Exception::~Exception((Exception *)auStack_740);
  }
  if (local_8e8[0] == true) {
    kj::Exception::~Exception((Exception *)(local_8e8 + 8));
  }
  if ((local_8f0 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[85],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x171,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.get(\\\"foo\\\"); }) != kj::none\", _kjCondition"
               ,(char (*) [85])
                "failed: expected ::kj::runCatchingExceptions([&]() { root.get(\"foo\"); }) != kj::none"
               ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_aa0);
  }
  if (local_aa0[0] == true) {
    kj::Exception::~Exception((Exception *)(local_aa0 + 8));
  }
  SVar1.super_Schema.raw = (Schema)(Schema)local_ad0.schema;
  StructBuilder::asReader(&local_ad0.builder);
  local_350.schema.super_Schema.raw = SVar1.super_Schema.raw;
  name_08.content.size_ = 4;
  name_08.content.ptr = "foo";
  DynamicStruct::Reader::get(&local_1b0,&local_350,name_08);
  DynamicValue::Reader::~Reader(&local_1b0);
  local_8e8._0_8_ = local_8e8._0_8_ & 0xffffffffffffff00;
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)local_748,(Maybe<kj::Exception> *)local_8e8);
  bVar4 = (bool)local_748[0];
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)local_aa0,(Maybe<kj::Exception> *)local_748);
  local_908 = (None *)&kj::none;
  local_900 = " != ";
  local_8f8 = 5;
  local_8f0 = bVar4;
  if ((bool)local_748[0] == true) {
    kj::Exception::~Exception((Exception *)auStack_740);
  }
  if (local_8e8[0] == true) {
    kj::Exception::~Exception((Exception *)(local_8e8 + 8));
  }
  if ((local_8f0 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[96],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x172,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.asReader().get(\\\"foo\\\"); }) != kj::none\", _kjCondition"
               ,(char (*) [96])
                "failed: expected ::kj::runCatchingExceptions([&]() { root.asReader().get(\"foo\"); }) != kj::none"
               ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_aa0);
  }
  if (local_aa0[0] == true) {
    kj::Exception::~Exception((Exception *)(local_aa0 + 8));
  }
  local_aa0._0_4_ = 3;
  local_aa0._8_4_ = 0x7b;
  local_aa0._12_4_ = 0;
  name_34.content.size_ = 4;
  name_34.content.ptr = "foo";
  DynamicStruct::Builder::set(&local_ad0,name_34,(Reader *)local_aa0);
  DynamicValue::Reader::~Reader((Reader *)local_aa0);
  name_09.content.size_ = 4;
  name_09.content.ptr = "foo";
  StructSchema::getFieldByName((Field *)local_8e8,&local_ad8,name_09);
  uVar3 = local_8e8._8_4_;
  uVar2 = local_8e8._0_8_;
  local_568 = local_8e8._12_4_;
  uStack_564 = local_8e8._16_4_;
  uStack_560 = local_8e8._20_4_;
  uStack_55c = local_8e8._24_4_;
  local_558._4_4_ = local_8e8._32_4_;
  local_558._0_4_ = local_8e8._28_4_;
  uStack_550._4_4_ = local_8e8._40_4_;
  uStack_550._0_4_ = local_8e8._36_4_;
  local_548 = (undefined7)CONCAT44(local_8e8._48_4_,local_8e8._44_4_);
  uStack_541 = SUB41(local_8e8._48_4_,3);
  uStack_540 = (undefined7)CONCAT44(local_8e8._56_4_,local_8e8._52_4_);
  uStack_539 = SUB41(local_8e8._56_4_,3);
  local_538 = local_8e8._60_4_;
  DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)local_748,&local_ad0);
  if ((bool)local_748[0] != true) {
    local_5b0.type = UNKNOWN;
    local_5b0._4_4_ = 0;
    local_748 = (undefined1  [8])0x0;
    auStack_740._0_8_ = (Schema)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_5b0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_5b0);
  }
  local_aa0._80_4_ = auStack_740._16_4_;
  local_aa0._76_4_ = auStack_740._12_4_;
  local_aa0._120_4_ = auStack_740._56_4_;
  local_aa0._116_4_ = auStack_740._52_4_;
  local_aa0._124_4_ = auStack_740._60_4_;
  local_aa0._0_8_ = uVar2;
  local_aa0._8_4_ = uVar3;
  local_aa0[0x33] = uStack_541;
  local_aa0._44_7_ = local_548;
  local_aa0[0x3b] = uStack_539;
  local_aa0._52_7_ = uStack_540;
  local_aa0._12_4_ = local_568;
  local_aa0._16_4_ = uStack_564;
  local_aa0._20_4_ = uStack_560;
  local_aa0._24_4_ = uStack_55c;
  local_aa0._28_8_ = local_558;
  local_aa0._36_8_ = uStack_550;
  local_aa0._60_4_ = local_538;
  local_aa0._64_8_ = auStack_740._0_8_;
  local_aa0._72_4_ = auStack_740._8_4_;
  local_aa0._128_8_ = " == ";
  local_aa0._136_8_ = &DAT_00000005;
  local_aa0[0x90] = uVar3 == auStack_740._8_4_ && uVar2 == auStack_740._0_8_;
  if ((uVar3 != auStack_740._8_4_ || uVar2 != auStack_740._0_8_) && (kj::_::Debug::minSeverity < 3))
  {
    name_10.content.size_ = 4;
    name_10.content.ptr = "foo";
    StructSchema::getFieldByName((Field *)&local_5b0,&local_ad8,name_10);
    DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)local_8e8,&local_ad0);
    if (local_8e8[0] != true) {
      local_3d8.type = UNKNOWN;
      local_3d8._4_4_ = 0;
      local_8e8._0_8_ = (RawBrandedSchema *)0x0;
      local_8e8._8_4_ = 0;
      local_8e8._12_4_ = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_3d8,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_3d8);
    }
    auStack_740._4_4_ = local_8e8._12_4_;
    auStack_740._0_4_ = local_8e8._8_4_;
    pAStack_529 = (ArrayDisposer *)local_8e8._64_8_;
    uStack_541 = (undefined1)local_8e8._40_4_;
    uStack_540 = (undefined7)(CONCAT44(local_8e8._44_4_,local_8e8._40_4_) >> 8);
    uStack_539 = (undefined1)local_8e8._48_4_;
    local_538 = (undefined4)(CONCAT44(local_8e8._52_4_,local_8e8._48_4_) >> 8);
    uStack_534 = SUB43(local_8e8._52_4_,1);
    local_748[0] = 1;
    auStack_740._8_4_ = local_8e8._16_4_;
    auStack_740._12_4_ = local_8e8._20_4_;
    auStack_740._16_4_ = local_8e8._24_4_;
    auStack_740._52_4_ = local_8e8._60_4_;
    auStack_740._56_4_ = (undefined4)local_8e8._64_8_;
    auStack_740._60_4_ = SUB84(local_8e8._64_8_,4);
    kj::_::Debug::
    log<char_const(&)[387],kj::_::DebugComparison<capnp::StructSchema::Field,capnp::StructSchema::Field>&,capnp::StructSchema::Field,capnp::StructSchema::Field>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x175,ERROR,
               "\"failed: expected \" \"(schema.getFieldByName(\\\"foo\\\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\\\", 373, ::kj::Exception::Type::FAILED, \\\"root.which()\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", _kjCondition, schema.getFieldByName(\"foo\"), (*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 373, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
               ,(char (*) [387])
                "failed: expected (schema.getFieldByName(\"foo\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 373, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
               ,(DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> *)local_aa0
               ,(Field *)&local_5b0,(Field *)auStack_740);
  }
  name_11.content.size_ = 4;
  name_11.content.ptr = "foo";
  DynamicStruct::Builder::get((Builder *)local_aa0,&local_ad0,name_11);
  local_748._4_4_ =
       DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Builder *)local_aa0);
  local_748._0_4_ = 0x7b;
  auStack_740._0_8_ = " == ";
  auStack_740._8_4_ = 5;
  auStack_740._12_4_ = 0;
  auStack_740[0x10] = local_748._4_4_ == 0x7b;
  DynamicValue::Builder::~Builder((Builder *)local_aa0);
  if ((auStack_740[0x10] == '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_8e8._0_4_ = 0x7b;
    name_12.content.size_ = 4;
    name_12.content.ptr = "foo";
    DynamicStruct::Builder::get((Builder *)local_aa0,&local_ad0,name_12);
    local_568 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                          ((Builder *)local_aa0);
    kj::_::Debug::
    log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x176,ERROR,
               "\"failed: expected \" \"(123u) == (root.get(\\\"foo\\\").as<uint>())\", _kjCondition, 123u, root.get(\"foo\").as<uint>()"
               ,(char (*) [56])"failed: expected (123u) == (root.get(\"foo\").as<uint>())",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_748,(uint *)local_8e8,&local_568
              );
    DynamicValue::Builder::~Builder((Builder *)local_aa0);
  }
  SVar1.super_Schema.raw = (Schema)(Schema)local_ad0.schema;
  StructBuilder::asReader(&local_ad0.builder);
  local_748 = (undefined1  [8])SVar1.super_Schema.raw;
  name_13.content.size_ = 4;
  name_13.content.ptr = "foo";
  DynamicStruct::Reader::get((Reader *)local_aa0,(Reader *)local_748,name_13);
  local_8e8._4_4_ =
       DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)local_aa0);
  local_8e8._0_4_ = 0x7b;
  local_8e8._8_4_ = 0x4d6514;
  local_8e8._12_4_ = 0;
  local_8e8._16_4_ = 5;
  local_8e8._20_4_ = 0;
  local_8e8[0x18] = local_8e8._4_4_ == 0x7b;
  DynamicValue::Reader::~Reader((Reader *)local_aa0);
  SVar1.super_Schema.raw = (Schema)(Schema)local_ad0.schema;
  if ((local_8e8[0x18] == '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_568 = 0x7b;
    StructBuilder::asReader(&local_ad0.builder);
    local_748 = (undefined1  [8])SVar1.super_Schema.raw;
    name_14.content.size_ = 4;
    name_14.content.ptr = "foo";
    DynamicStruct::Reader::get((Reader *)local_aa0,(Reader *)local_748,name_14);
    TVar5 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)local_aa0);
    local_5b0.type = TVar5;
    kj::_::Debug::
    log<char_const(&)[67],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x177,ERROR,
               "\"failed: expected \" \"(123u) == (root.asReader().get(\\\"foo\\\").as<uint>())\", _kjCondition, 123u, root.asReader().get(\"foo\").as<uint>()"
               ,(char (*) [67])
                "failed: expected (123u) == (root.asReader().get(\"foo\").as<uint>())",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_8e8,&local_568,&local_5b0.type);
    DynamicValue::Reader::~Reader((Reader *)local_aa0);
  }
  name_15.content.size_ = 4;
  name_15.content.ptr = "bar";
  DynamicStruct::Builder::get(&local_230,&local_ad0,name_15);
  DynamicValue::Builder::~Builder(&local_230);
  local_8e8._0_8_ = local_8e8._0_8_ & 0xffffffffffffff00;
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)local_748,(Maybe<kj::Exception> *)local_8e8);
  bVar4 = (bool)local_748[0];
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)local_aa0,(Maybe<kj::Exception> *)local_748);
  local_908 = (None *)&kj::none;
  local_900 = " != ";
  local_8f8 = 5;
  local_8f0 = bVar4;
  if ((bool)local_748[0] == true) {
    kj::Exception::~Exception((Exception *)auStack_740);
  }
  if (local_8e8[0] == true) {
    kj::Exception::~Exception((Exception *)(local_8e8 + 8));
  }
  if ((local_8f0 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[85],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x178,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.get(\\\"bar\\\"); }) != kj::none\", _kjCondition"
               ,(char (*) [85])
                "failed: expected ::kj::runCatchingExceptions([&]() { root.get(\"bar\"); }) != kj::none"
               ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_aa0);
  }
  if (local_aa0[0] == true) {
    kj::Exception::~Exception((Exception *)(local_aa0 + 8));
  }
  SVar1.super_Schema.raw = (Schema)(Schema)local_ad0.schema;
  StructBuilder::asReader(&local_ad0.builder);
  local_318.schema.super_Schema.raw = SVar1.super_Schema.raw;
  name_16.content.size_ = 4;
  name_16.content.ptr = "bar";
  DynamicStruct::Reader::get(&local_168,&local_318,name_16);
  DynamicValue::Reader::~Reader(&local_168);
  local_8e8._0_8_ = local_8e8._0_8_ & 0xffffffffffffff00;
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)local_748,(Maybe<kj::Exception> *)local_8e8);
  bVar4 = (bool)local_748[0];
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)local_aa0,(Maybe<kj::Exception> *)local_748);
  local_908 = (None *)&kj::none;
  local_900 = " != ";
  local_8f8 = 5;
  local_8f0 = bVar4;
  if ((bool)local_748[0] == true) {
    kj::Exception::~Exception((Exception *)auStack_740);
  }
  if (local_8e8[0] == true) {
    kj::Exception::~Exception((Exception *)(local_8e8 + 8));
  }
  if ((local_8f0 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[96],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x179,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.asReader().get(\\\"bar\\\"); }) != kj::none\", _kjCondition"
               ,(char (*) [96])
                "failed: expected ::kj::runCatchingExceptions([&]() { root.asReader().get(\"bar\"); }) != kj::none"
               ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_aa0);
  }
  if (local_aa0[0] == true) {
    kj::Exception::~Exception((Exception *)(local_aa0 + 8));
  }
  local_aa0._0_4_ = 3;
  local_aa0._8_4_ = 0x141;
  local_aa0._12_4_ = 0;
  name_35.content.size_ = 4;
  name_35.content.ptr = "bar";
  DynamicStruct::Builder::set(&local_ad0,name_35,(Reader *)local_aa0);
  DynamicValue::Reader::~Reader((Reader *)local_aa0);
  name_17.content.size_ = 4;
  name_17.content.ptr = "bar";
  StructSchema::getFieldByName((Field *)local_8e8,&local_ad8,name_17);
  uVar3 = local_8e8._8_4_;
  uVar2 = local_8e8._0_8_;
  local_568 = local_8e8._12_4_;
  uStack_564 = local_8e8._16_4_;
  uStack_560 = local_8e8._20_4_;
  uStack_55c = local_8e8._24_4_;
  local_558._4_4_ = local_8e8._32_4_;
  local_558._0_4_ = local_8e8._28_4_;
  uStack_550._4_4_ = local_8e8._40_4_;
  uStack_550._0_4_ = local_8e8._36_4_;
  local_548 = (undefined7)CONCAT44(local_8e8._48_4_,local_8e8._44_4_);
  uStack_541 = SUB41(local_8e8._48_4_,3);
  uStack_540 = (undefined7)CONCAT44(local_8e8._56_4_,local_8e8._52_4_);
  uStack_539 = SUB41(local_8e8._56_4_,3);
  local_538 = local_8e8._60_4_;
  DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)local_748,&local_ad0);
  if ((bool)local_748[0] != true) {
    local_5b0.type = UNKNOWN;
    local_5b0._4_4_ = 0;
    local_748 = (undefined1  [8])0x0;
    auStack_740._0_8_ = (Schema)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_5b0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_5b0);
  }
  local_aa0._80_4_ = auStack_740._16_4_;
  local_aa0._76_4_ = auStack_740._12_4_;
  local_aa0._120_4_ = auStack_740._56_4_;
  local_aa0._116_4_ = auStack_740._52_4_;
  local_aa0._124_4_ = auStack_740._60_4_;
  local_aa0._0_8_ = uVar2;
  local_aa0._8_4_ = uVar3;
  local_aa0[0x33] = uStack_541;
  local_aa0._44_7_ = local_548;
  local_aa0[0x3b] = uStack_539;
  local_aa0._52_7_ = uStack_540;
  local_aa0._12_4_ = local_568;
  local_aa0._16_4_ = uStack_564;
  local_aa0._20_4_ = uStack_560;
  local_aa0._24_4_ = uStack_55c;
  local_aa0._28_8_ = local_558;
  local_aa0._36_8_ = uStack_550;
  local_aa0._60_4_ = local_538;
  local_aa0._64_8_ = auStack_740._0_8_;
  local_aa0._72_4_ = auStack_740._8_4_;
  local_aa0._128_8_ = " == ";
  local_aa0._136_8_ = &DAT_00000005;
  local_aa0[0x90] = uVar3 == auStack_740._8_4_ && uVar2 == auStack_740._0_8_;
  if ((uVar3 != auStack_740._8_4_ || uVar2 != auStack_740._0_8_) && (kj::_::Debug::minSeverity < 3))
  {
    name_18.content.size_ = 4;
    name_18.content.ptr = "bar";
    StructSchema::getFieldByName((Field *)&local_5b0,&local_ad8,name_18);
    DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)local_8e8,&local_ad0);
    if (local_8e8[0] != true) {
      local_3d8.type = UNKNOWN;
      local_3d8._4_4_ = 0;
      local_8e8._0_8_ = (RawBrandedSchema *)0x0;
      local_8e8._8_4_ = 0;
      local_8e8._12_4_ = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_3d8,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_3d8);
    }
    auStack_740._4_4_ = local_8e8._12_4_;
    auStack_740._0_4_ = local_8e8._8_4_;
    pAStack_529 = (ArrayDisposer *)local_8e8._64_8_;
    uStack_541 = (undefined1)local_8e8._40_4_;
    uStack_540 = (undefined7)(CONCAT44(local_8e8._44_4_,local_8e8._40_4_) >> 8);
    uStack_539 = (undefined1)local_8e8._48_4_;
    local_538 = (undefined4)(CONCAT44(local_8e8._52_4_,local_8e8._48_4_) >> 8);
    uStack_534 = SUB43(local_8e8._52_4_,1);
    local_748[0] = 1;
    auStack_740._8_4_ = local_8e8._16_4_;
    auStack_740._12_4_ = local_8e8._20_4_;
    auStack_740._16_4_ = local_8e8._24_4_;
    auStack_740._52_4_ = local_8e8._60_4_;
    auStack_740._56_4_ = (undefined4)local_8e8._64_8_;
    auStack_740._60_4_ = SUB84(local_8e8._64_8_,4);
    kj::_::Debug::
    log<char_const(&)[387],kj::_::DebugComparison<capnp::StructSchema::Field,capnp::StructSchema::Field>&,capnp::StructSchema::Field,capnp::StructSchema::Field>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x17c,ERROR,
               "\"failed: expected \" \"(schema.getFieldByName(\\\"bar\\\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\\\", 380, ::kj::Exception::Type::FAILED, \\\"root.which()\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", _kjCondition, schema.getFieldByName(\"bar\"), (*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 380, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
               ,(char (*) [387])
                "failed: expected (schema.getFieldByName(\"bar\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 380, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
               ,(DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> *)local_aa0
               ,(Field *)&local_5b0,(Field *)auStack_740);
  }
  name_19.content.size_ = 4;
  name_19.content.ptr = "bar";
  DynamicStruct::Builder::get((Builder *)local_aa0,&local_ad0,name_19);
  local_748._4_4_ =
       DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Builder *)local_aa0);
  local_748._0_4_ = 0x141;
  auStack_740._0_8_ = " == ";
  auStack_740._8_4_ = 5;
  auStack_740._12_4_ = 0;
  auStack_740[0x10] = local_748._4_4_ == 0x141;
  DynamicValue::Builder::~Builder((Builder *)local_aa0);
  if ((auStack_740[0x10] == '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_8e8._0_4_ = 0x141;
    name_20.content.size_ = 4;
    name_20.content.ptr = "bar";
    DynamicStruct::Builder::get((Builder *)local_aa0,&local_ad0,name_20);
    local_568 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                          ((Builder *)local_aa0);
    kj::_::Debug::
    log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x17d,ERROR,
               "\"failed: expected \" \"(321u) == (root.get(\\\"bar\\\").as<uint>())\", _kjCondition, 321u, root.get(\"bar\").as<uint>()"
               ,(char (*) [56])"failed: expected (321u) == (root.get(\"bar\").as<uint>())",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_748,(uint *)local_8e8,&local_568
              );
    DynamicValue::Builder::~Builder((Builder *)local_aa0);
  }
  SVar1.super_Schema.raw = (Schema)(Schema)local_ad0.schema;
  StructBuilder::asReader(&local_ad0.builder);
  local_748 = (undefined1  [8])SVar1.super_Schema.raw;
  name_21.content.size_ = 4;
  name_21.content.ptr = "bar";
  DynamicStruct::Reader::get((Reader *)local_aa0,(Reader *)local_748,name_21);
  local_8e8._4_4_ =
       DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)local_aa0);
  local_8e8._0_4_ = 0x141;
  local_8e8._8_4_ = 0x4d6514;
  local_8e8._12_4_ = 0;
  local_8e8._16_4_ = 5;
  local_8e8._20_4_ = 0;
  local_8e8[0x18] = local_8e8._4_4_ == 0x141;
  DynamicValue::Reader::~Reader((Reader *)local_aa0);
  SVar1.super_Schema.raw = (Schema)(Schema)local_ad0.schema;
  if ((local_8e8[0x18] == '\0') && (kj::_::Debug::minSeverity < 3)) {
    local_568 = 0x141;
    StructBuilder::asReader(&local_ad0.builder);
    local_748 = (undefined1  [8])SVar1.super_Schema.raw;
    name_22.content.size_ = 4;
    name_22.content.ptr = "bar";
    DynamicStruct::Reader::get((Reader *)local_aa0,(Reader *)local_748,name_22);
    TVar5 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)local_aa0);
    local_5b0.type = TVar5;
    kj::_::Debug::
    log<char_const(&)[67],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x17e,ERROR,
               "\"failed: expected \" \"(321u) == (root.asReader().get(\\\"bar\\\").as<uint>())\", _kjCondition, 321u, root.asReader().get(\"bar\").as<uint>()"
               ,(char (*) [67])
                "failed: expected (321u) == (root.asReader().get(\"bar\").as<uint>())",
               (DebugComparison<unsigned_int,_unsigned_int> *)local_8e8,&local_568,&local_5b0.type);
    DynamicValue::Reader::~Reader((Reader *)local_aa0);
  }
  name_23.content.size_ = 4;
  name_23.content.ptr = "foo";
  DynamicStruct::Builder::get(&local_1f0,&local_ad0,name_23);
  DynamicValue::Builder::~Builder(&local_1f0);
  local_8e8._0_8_ = local_8e8._0_8_ & 0xffffffffffffff00;
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)local_748,(Maybe<kj::Exception> *)local_8e8);
  bVar4 = (bool)local_748[0];
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)local_aa0,(Maybe<kj::Exception> *)local_748);
  local_908 = (None *)&kj::none;
  local_900 = " != ";
  local_8f8 = 5;
  local_8f0 = bVar4;
  if ((bool)local_748[0] == true) {
    kj::Exception::~Exception((Exception *)auStack_740);
  }
  if (local_8e8[0] == true) {
    kj::Exception::~Exception((Exception *)(local_8e8 + 8));
  }
  if ((local_8f0 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[85],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x17f,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.get(\\\"foo\\\"); }) != kj::none\", _kjCondition"
               ,(char (*) [85])
                "failed: expected ::kj::runCatchingExceptions([&]() { root.get(\"foo\"); }) != kj::none"
               ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_aa0);
  }
  if (local_aa0[0] == true) {
    kj::Exception::~Exception((Exception *)(local_aa0 + 8));
  }
  SVar1.super_Schema.raw = (Schema)(Schema)local_ad0.schema;
  StructBuilder::asReader(&local_ad0.builder);
  local_2e0.schema.super_Schema.raw = SVar1.super_Schema.raw;
  name_24.content.size_ = 4;
  name_24.content.ptr = "foo";
  DynamicStruct::Reader::get(&local_3d8,&local_2e0,name_24);
  DynamicValue::Reader::~Reader(&local_3d8);
  local_8e8._0_8_ = local_8e8._0_8_ & 0xffffffffffffff00;
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)local_748,(Maybe<kj::Exception> *)local_8e8);
  bVar4 = (bool)local_748[0];
  kj::Maybe<kj::Exception>::Maybe
            ((Maybe<kj::Exception> *)local_aa0,(Maybe<kj::Exception> *)local_748);
  local_908 = (None *)&kj::none;
  local_900 = " != ";
  local_8f8 = 5;
  local_8f0 = bVar4;
  if ((bool)local_748[0] == true) {
    kj::Exception::~Exception((Exception *)auStack_740);
  }
  if (local_8e8[0] == true) {
    kj::Exception::~Exception((Exception *)(local_8e8 + 8));
  }
  if ((local_8f0 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[96],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x180,ERROR,
               "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.asReader().get(\\\"foo\\\"); }) != kj::none\", _kjCondition"
               ,(char (*) [96])
                "failed: expected ::kj::runCatchingExceptions([&]() { root.asReader().get(\"foo\"); }) != kj::none"
               ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_aa0);
  }
  if (local_aa0[0] == true) {
    kj::Exception::~Exception((Exception *)(local_aa0 + 8));
  }
  local_aa0._0_4_ = 3;
  local_aa0._8_4_ = 0x7b;
  local_aa0._12_4_ = 0;
  name_36.content.size_ = 4;
  name_36.content.ptr = "foo";
  DynamicStruct::Builder::set(&local_ad0,name_36,(Reader *)local_aa0);
  DynamicValue::Reader::~Reader((Reader *)local_aa0);
  name_25.content.size_ = 4;
  name_25.content.ptr = "foo";
  StructSchema::getFieldByName((Field *)local_8e8,&local_ad8,name_25);
  uVar3 = local_8e8._8_4_;
  uVar2 = local_8e8._0_8_;
  local_568 = local_8e8._12_4_;
  uStack_564 = local_8e8._16_4_;
  uStack_560 = local_8e8._20_4_;
  uStack_55c = local_8e8._24_4_;
  local_558._4_4_ = local_8e8._32_4_;
  local_558._0_4_ = local_8e8._28_4_;
  uStack_550._4_4_ = local_8e8._40_4_;
  uStack_550._0_4_ = local_8e8._36_4_;
  local_548 = (undefined7)CONCAT44(local_8e8._48_4_,local_8e8._44_4_);
  uStack_541 = SUB41(local_8e8._48_4_,3);
  uStack_540 = (undefined7)CONCAT44(local_8e8._56_4_,local_8e8._52_4_);
  uStack_539 = SUB41(local_8e8._56_4_,3);
  local_538 = local_8e8._60_4_;
  DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)local_748,&local_ad0);
  if ((bool)local_748[0] == true) {
    local_aa0._80_4_ = auStack_740._16_4_;
    local_aa0._76_4_ = auStack_740._12_4_;
    local_aa0._120_4_ = auStack_740._56_4_;
    local_aa0._116_4_ = auStack_740._52_4_;
    local_aa0._124_4_ = auStack_740._60_4_;
    local_aa0._0_8_ = uVar2;
    local_aa0._8_4_ = uVar3;
    local_aa0[0x33] = uStack_541;
    local_aa0._44_7_ = local_548;
    local_aa0[0x3b] = uStack_539;
    local_aa0._52_7_ = uStack_540;
    local_aa0._12_4_ = local_568;
    local_aa0._16_4_ = uStack_564;
    local_aa0._20_4_ = uStack_560;
    local_aa0._24_4_ = uStack_55c;
    local_aa0._28_8_ = local_558;
    local_aa0._36_8_ = uStack_550;
    local_aa0._60_4_ = local_538;
    local_aa0._64_8_ = auStack_740._0_8_;
    local_aa0._72_4_ = auStack_740._8_4_;
    local_aa0._128_8_ = " == ";
    local_aa0._136_8_ = &DAT_00000005;
    local_aa0[0x90] = uVar3 == auStack_740._8_4_ && uVar2 == auStack_740._0_8_;
    if ((uVar3 != auStack_740._8_4_ || uVar2 != auStack_740._0_8_) &&
       (kj::_::Debug::minSeverity < 3)) {
      name_26.content.size_ = 4;
      name_26.content.ptr = "foo";
      StructSchema::getFieldByName((Field *)&local_5b0,&local_ad8,name_26);
      DynamicStruct::Builder::which((Maybe<capnp::StructSchema::Field> *)local_8e8,&local_ad0);
      if (local_8e8[0] != true) {
        local_390.type = UNKNOWN;
        local_390._4_4_ = 0;
        local_8e8._0_8_ = (RawBrandedSchema *)0x0;
        local_8e8._8_4_ = 0;
        local_8e8._12_4_ = 0;
        kj::_::Debug::Fault::init
                  ((Fault *)&local_390,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                  );
        kj::_::Debug::Fault::fatal((Fault *)&local_390);
      }
      auStack_740._4_4_ = local_8e8._12_4_;
      auStack_740._0_4_ = local_8e8._8_4_;
      pAStack_529 = (ArrayDisposer *)local_8e8._64_8_;
      uStack_541 = (undefined1)local_8e8._40_4_;
      uStack_540 = (undefined7)(CONCAT44(local_8e8._44_4_,local_8e8._40_4_) >> 8);
      uStack_539 = (undefined1)local_8e8._48_4_;
      local_538 = (undefined4)(CONCAT44(local_8e8._52_4_,local_8e8._48_4_) >> 8);
      uStack_534 = SUB43(local_8e8._52_4_,1);
      local_748[0] = 1;
      auStack_740._8_4_ = local_8e8._16_4_;
      auStack_740._12_4_ = local_8e8._20_4_;
      auStack_740._16_4_ = local_8e8._24_4_;
      auStack_740._56_4_ = (undefined4)local_8e8._64_8_;
      auStack_740._60_4_ = SUB84(local_8e8._64_8_,4);
      kj::_::Debug::
      log<char_const(&)[387],kj::_::DebugComparison<capnp::StructSchema::Field,capnp::StructSchema::Field>&,capnp::StructSchema::Field,capnp::StructSchema::Field>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x183,ERROR,
                 "\"failed: expected \" \"(schema.getFieldByName(\\\"foo\\\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\\\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\\\", 387, ::kj::Exception::Type::FAILED, \\\"root.which()\\\" \\\" != nullptr\\\", \\\"\\\").fatal(); } kj::mv(_kj_result); })))\", _kjCondition, schema.getFieldByName(\"foo\"), (*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 387, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); }))"
                 ,(char (*) [387])
                  "failed: expected (schema.getFieldByName(\"foo\")) == ((*({ auto _kj_result = ::kj::_::readMaybe(root.which()); if (__builtin_expect(!_kj_result, false)) { ::kj::_::Debug::Fault(\"/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++\", 387, ::kj::Exception::Type::FAILED, \"root.which()\" \" != nullptr\", \"\").fatal(); } kj::mv(_kj_result); })))"
                 ,(DebugComparison<capnp::StructSchema::Field,_capnp::StructSchema::Field> *)
                  local_aa0,(Field *)&local_5b0,(Field *)auStack_740);
    }
    name_27.content.size_ = 4;
    name_27.content.ptr = "foo";
    DynamicStruct::Builder::get((Builder *)local_aa0,&local_ad0,name_27);
    local_748._4_4_ =
         DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Builder *)local_aa0);
    local_748._0_4_ = 0x7b;
    auStack_740._0_8_ = " == ";
    auStack_740._8_4_ = 5;
    auStack_740._12_4_ = 0;
    auStack_740[0x10] = local_748._4_4_ == 0x7b;
    DynamicValue::Builder::~Builder((Builder *)local_aa0);
    if ((auStack_740[0x10] == '\0') && (kj::_::Debug::minSeverity < 3)) {
      local_8e8._0_4_ = 0x7b;
      name_28.content.size_ = 4;
      name_28.content.ptr = "foo";
      DynamicStruct::Builder::get((Builder *)local_aa0,&local_ad0,name_28);
      local_568 = DynamicValue::Builder::AsImpl<unsigned_int,_(capnp::Kind)0>::apply
                            ((Builder *)local_aa0);
      kj::_::Debug::
      log<char_const(&)[56],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x184,ERROR,
                 "\"failed: expected \" \"(123u) == (root.get(\\\"foo\\\").as<uint>())\", _kjCondition, 123u, root.get(\"foo\").as<uint>()"
                 ,(char (*) [56])"failed: expected (123u) == (root.get(\"foo\").as<uint>())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_748,(uint *)local_8e8,
                 &local_568);
      DynamicValue::Builder::~Builder((Builder *)local_aa0);
    }
    SVar1.super_Schema.raw = (Schema)(Schema)local_ad0.schema;
    StructBuilder::asReader(&local_ad0.builder);
    local_748 = (undefined1  [8])SVar1.super_Schema.raw;
    name_29.content.size_ = 4;
    name_29.content.ptr = "foo";
    DynamicStruct::Reader::get((Reader *)local_aa0,(Reader *)local_748,name_29);
    local_8e8._4_4_ =
         DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)local_aa0);
    local_8e8._0_4_ = 0x7b;
    local_8e8._8_4_ = 0x4d6514;
    local_8e8._12_4_ = 0;
    local_8e8._16_4_ = 5;
    local_8e8._20_4_ = 0;
    local_8e8[0x18] = local_8e8._4_4_ == 0x7b;
    DynamicValue::Reader::~Reader((Reader *)local_aa0);
    SVar1.super_Schema.raw = (Schema)(Schema)local_ad0.schema;
    if ((local_8e8[0x18] == '\0') && (kj::_::Debug::minSeverity < 3)) {
      local_568 = 0x7b;
      StructBuilder::asReader(&local_ad0.builder);
      local_748 = (undefined1  [8])SVar1.super_Schema.raw;
      name_30.content.size_ = 4;
      name_30.content.ptr = "foo";
      DynamicStruct::Reader::get((Reader *)local_aa0,(Reader *)local_748,name_30);
      TVar5 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)local_aa0)
      ;
      local_5b0.type = TVar5;
      kj::_::Debug::
      log<char_const(&)[67],kj::_::DebugComparison<unsigned_int,unsigned_int>&,unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x185,ERROR,
                 "\"failed: expected \" \"(123u) == (root.asReader().get(\\\"foo\\\").as<uint>())\", _kjCondition, 123u, root.asReader().get(\"foo\").as<uint>()"
                 ,(char (*) [67])
                  "failed: expected (123u) == (root.asReader().get(\"foo\").as<uint>())",
                 (DebugComparison<unsigned_int,_unsigned_int> *)local_8e8,&local_568,&local_5b0.type
                );
      DynamicValue::Reader::~Reader((Reader *)local_aa0);
    }
    name_31.content.size_ = 4;
    name_31.content.ptr = "bar";
    DynamicStruct::Builder::get(&local_390,&local_ad0,name_31);
    DynamicValue::Builder::~Builder(&local_390);
    local_8e8._0_8_ = local_8e8._0_8_ & 0xffffffffffffff00;
    kj::Maybe<kj::Exception>::Maybe
              ((Maybe<kj::Exception> *)local_748,(Maybe<kj::Exception> *)local_8e8);
    bVar4 = (bool)local_748[0];
    kj::Maybe<kj::Exception>::Maybe
              ((Maybe<kj::Exception> *)local_aa0,(Maybe<kj::Exception> *)local_748);
    local_908 = (None *)&kj::none;
    local_900 = " != ";
    local_8f8 = 5;
    local_8f0 = bVar4;
    if ((bool)local_748[0] == true) {
      kj::Exception::~Exception((Exception *)auStack_740);
    }
    if (local_8e8[0] == true) {
      kj::Exception::~Exception((Exception *)(local_8e8 + 8));
    }
    if ((local_8f0 == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::
      log<char_const(&)[85],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x186,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.get(\\\"bar\\\"); }) != kj::none\", _kjCondition"
                 ,(char (*) [85])
                  "failed: expected ::kj::runCatchingExceptions([&]() { root.get(\"bar\"); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_aa0);
    }
    if (local_aa0[0] == true) {
      kj::Exception::~Exception((Exception *)(local_aa0 + 8));
    }
    StructBuilder::asReader(&local_ad0.builder);
    local_2a8.schema.super_Schema.raw = local_ad0.schema.super_Schema.raw;
    name_32.content.size_ = 4;
    name_32.content.ptr = "bar";
    DynamicStruct::Reader::get(&local_5b0,&local_2a8,name_32);
    DynamicValue::Reader::~Reader(&local_5b0);
    local_8e8._0_8_ = local_8e8._0_8_ & 0xffffffffffffff00;
    kj::Maybe<kj::Exception>::Maybe
              ((Maybe<kj::Exception> *)local_748,(Maybe<kj::Exception> *)local_8e8);
    bVar4 = (bool)local_748[0];
    kj::Maybe<kj::Exception>::Maybe
              ((Maybe<kj::Exception> *)local_aa0,(Maybe<kj::Exception> *)local_748);
    local_908 = (None *)&kj::none;
    local_900 = " != ";
    local_8f8 = 5;
    local_8f0 = bVar4;
    if ((bool)local_748[0] == true) {
      kj::Exception::~Exception((Exception *)auStack_740);
    }
    if (local_8e8[0] == true) {
      kj::Exception::~Exception((Exception *)(local_8e8 + 8));
    }
    if ((local_8f0 == false) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::
      log<char_const(&)[96],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x187,ERROR,
                 "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.asReader().get(\\\"bar\\\"); }) != kj::none\", _kjCondition"
                 ,(char (*) [96])
                  "failed: expected ::kj::runCatchingExceptions([&]() { root.asReader().get(\"bar\"); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_aa0);
    }
    if (local_aa0[0] == true) {
      kj::Exception::~Exception((Exception *)(local_aa0 + 8));
    }
    MallocMessageBuilder::~MallocMessageBuilder(&local_120);
    return;
  }
  local_5b0.type = UNKNOWN;
  local_5b0._4_4_ = 0;
  local_748 = (undefined1  [8])0x0;
  auStack_740._0_8_ = (Schema)0x0;
  kj::_::Debug::Fault::init
            ((Fault *)&local_5b0,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
            );
  kj::_::Debug::Fault::fatal((Fault *)&local_5b0);
}

Assistant:

TEST(DynamicApi, UnnamedUnion) {
  MallocMessageBuilder builder;
  StructSchema schema = Schema::from<test::TestUnnamedUnion>();
  auto root = builder.initRoot<DynamicStruct>(schema);

  EXPECT_EQ(schema.getFieldByName("foo"), KJ_ASSERT_NONNULL(root.which()));

  root.set("bar", 321);
  EXPECT_EQ(schema.getFieldByName("bar"), KJ_ASSERT_NONNULL(root.which()));
  EXPECT_EQ(321u, root.get("bar").as<uint>());
  EXPECT_EQ(321u, root.asReader().get("bar").as<uint>());
  EXPECT_ANY_THROW(root.get("foo"));
  EXPECT_ANY_THROW(root.asReader().get("foo"));

  root.set("foo", 123);
  EXPECT_EQ(schema.getFieldByName("foo"), KJ_ASSERT_NONNULL(root.which()));
  EXPECT_EQ(123u, root.get("foo").as<uint>());
  EXPECT_EQ(123u, root.asReader().get("foo").as<uint>());
  EXPECT_ANY_THROW(root.get("bar"));
  EXPECT_ANY_THROW(root.asReader().get("bar"));

  root.set("bar", 321);
  EXPECT_EQ(schema.getFieldByName("bar"), KJ_ASSERT_NONNULL(root.which()));
  EXPECT_EQ(321u, root.get("bar").as<uint>());
  EXPECT_EQ(321u, root.asReader().get("bar").as<uint>());
  EXPECT_ANY_THROW(root.get("foo"));
  EXPECT_ANY_THROW(root.asReader().get("foo"));

  root.set("foo", 123);
  EXPECT_EQ(schema.getFieldByName("foo"), KJ_ASSERT_NONNULL(root.which()));
  EXPECT_EQ(123u, root.get("foo").as<uint>());
  EXPECT_EQ(123u, root.asReader().get("foo").as<uint>());
  EXPECT_ANY_THROW(root.get("bar"));
  EXPECT_ANY_THROW(root.asReader().get("bar"));
}